

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

void xmlParserInputShrink(xmlParserInputPtr in)

{
  xmlBufPtr buf;
  size_t sVar1;
  unsigned_long uVar2;
  size_t pos;
  
  if ((((in != (xmlParserInputPtr)0x0) && (in->buf != (xmlParserInputBufferPtr)0x0)) &&
      (in->base != (xmlChar *)0x0)) &&
     (((in->cur != (xmlChar *)0x0 && (buf = in->buf->buffer, buf != (xmlBufPtr)0x0)) &&
      (pos = (long)in->cur - (long)in->base, 0x50 < pos)))) {
    sVar1 = xmlBufShrink(buf,pos - 0x50);
    if (sVar1 != 0) {
      pos = pos - sVar1;
      uVar2 = 0xffffffffffffffff;
      if (!CARRY8(in->consumed,sVar1)) {
        uVar2 = in->consumed + sVar1;
      }
      in->consumed = uVar2;
    }
    xmlBufUpdateInput(in->buf->buffer,in,pos);
    return;
  }
  return;
}

Assistant:

void
xmlParserInputShrink(xmlParserInputPtr in) {
    size_t used;
    size_t ret;

    if (in == NULL) return;
    if (in->buf == NULL) return;
    if (in->base == NULL) return;
    if (in->cur == NULL) return;
    if (in->buf->buffer == NULL) return;

    used = in->cur - in->base;

    if (used > LINE_LEN) {
	ret = xmlBufShrink(in->buf->buffer, used - LINE_LEN);
	if (ret > 0) {
            used -= ret;
            if ((ret > ULONG_MAX) ||
                (in->consumed > ULONG_MAX - (unsigned long)ret))
                in->consumed = ULONG_MAX;
            else
                in->consumed += ret;
	}

        xmlBufUpdateInput(in->buf->buffer, in, used);
    }
}